

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O1

void __thiscall disp::h1_d(disp *this,double param)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  to_string<double>(&local_38,param);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x134d9e);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  local_50 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void h1_d(double param)
	{
		v_= "h1_d:"+to_string(param);
	}